

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O3

pool_ptr<soul::heart::Function> __thiscall soul::Module::Functions::findRunFunction(Functions *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long *in_RSI;
  pool_ref<soul::heart::Function> *ppVar5;
  string_view other;
  
  lVar1 = in_RSI[1];
  if (lVar1 == 0) {
    ppVar5 = (pool_ref<soul::heart::Function> *)0x0;
  }
  else {
    lVar2 = *in_RSI;
    ppVar5 = (pool_ref<soul::heart::Function> *)0x0;
    lVar4 = 0;
    do {
      other._M_str = "run";
      other._M_len = 3;
      bVar3 = Identifier::operator==((Identifier *)(*(long *)(lVar2 + lVar4) + 0x30),other);
      if (bVar3) {
        ppVar5 = *(pool_ref<soul::heart::Function> **)(lVar2 + lVar4);
        break;
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  (this->functions).items = ppVar5;
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> Module::Functions::findRunFunction() const        { return find (heart::getRunFunctionName()); }